

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O2

FT_UInt32 ps_unicode_value(char *glyph_name)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort *puVar4;
  int iVar5;
  int iVar6;
  char *p;
  long lVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  byte *pbVar12;
  ulong uVar13;
  uchar *puVar14;
  char cVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  
  bVar1 = *glyph_name;
  pbVar8 = (byte *)glyph_name;
  bVar3 = bVar1;
  if (bVar1 == 0x75) {
    if ((glyph_name[1] == 'n') && (glyph_name[2] == 'i')) {
      uVar10 = 0;
      for (lVar7 = 0; (int)lVar7 != 4; lVar7 = lVar7 + 1) {
        bVar2 = glyph_name[lVar7 + 3];
        uVar9 = bVar2 - 0x37;
        if (bVar2 - 0x47 < 0xfffffffa) {
          uVar9 = 0x10;
        }
        if (bVar2 - 0x30 < 10) {
          uVar9 = bVar2 - 0x30;
        }
        if (0xf < uVar9) goto LAB_001fcfd9;
        uVar10 = uVar9 | uVar10 << 4;
      }
      if (glyph_name[7] == '\0') {
        return uVar10;
      }
      if (glyph_name[7] != '.') goto LAB_001fcfd9;
    }
    else {
LAB_001fcfd9:
      pbVar12 = (byte *)(glyph_name + 7);
      pbVar11 = (byte *)(glyph_name + 1);
      uVar10 = 0;
      uVar9 = 6;
      while (uVar9 != 0) {
        bVar2 = *pbVar11;
        uVar16 = bVar2 - 0x37;
        if (bVar2 - 0x47 < 0xfffffffa) {
          uVar16 = 0x10;
        }
        if (bVar2 - 0x30 < 10) {
          uVar16 = bVar2 - 0x30;
        }
        if (0xf < uVar16) {
          pbVar12 = pbVar11;
          if (2 < uVar9) goto LAB_001fd059;
          break;
        }
        uVar10 = uVar16 | uVar10 << 4;
        pbVar11 = pbVar11 + 1;
        uVar9 = uVar9 - 1;
      }
      if (*pbVar12 == 0) {
        return uVar10;
      }
      if (*pbVar12 != 0x2e) goto LAB_001fd059;
    }
    uVar10 = uVar10 | 0x80000000;
  }
  else {
LAB_001fd059:
    while ((bVar3 != 0 && (bVar3 != 0x2e))) {
      pbVar12 = pbVar8 + 1;
      pbVar8 = pbVar8 + 1;
      bVar3 = *pbVar12;
    }
    uVar10 = 0;
    if (glyph_name < pbVar8) {
      uVar10 = 0;
      iVar6 = 0;
      iVar5 = 0x34;
      while (iVar17 = iVar5, uVar9 = 0, iVar6 < iVar17) {
        uVar13 = (ulong)(ushort)(*(ushort *)
                                  ("" + ((long)(iVar17 + iVar6) & 0xfffffffffffffffeU) + 2) << 8 |
                                *(ushort *)("" + ((long)(iVar17 + iVar6) & 0xfffffffffffffffeU) + 2)
                                >> 8);
        bVar2 = ""[uVar13];
        if ((bVar2 & 0x7f) == bVar1) {
          do {
            uVar16 = (uint)bVar2;
            puVar14 = "" + uVar13;
            while( true ) {
              glyph_name = (char *)((byte *)glyph_name + 1);
              cVar15 = (char)uVar16;
              uVar9 = uVar10;
              if (pbVar8 <= glyph_name) {
                if ((-1 < cVar15) && ((char)puVar14[1] < '\0')) {
                  uVar9 = (uint)(ushort)(*(ushort *)(puVar14 + 2) << 8 |
                                        *(ushort *)(puVar14 + 2) >> 8);
                }
                goto LAB_001fd14e;
              }
              uVar16 = (uint)puVar14[1];
              uVar18 = uVar16 & 0x7f;
              if (-1 < cVar15) break;
              puVar14 = puVar14 + 1;
              uVar9 = 0;
              if (*glyph_name != (byte)uVar18) goto LAB_001fd14e;
            }
            puVar4 = (ushort *)(puVar14 + (ulong)(puVar14[1] >> 7) * 2);
            while( true ) {
              puVar4 = puVar4 + 1;
              if ((int)uVar18 < 1) goto LAB_001fd14e;
              uVar13 = (ulong)(ushort)(*puVar4 << 8 | *puVar4 >> 8);
              bVar2 = ""[uVar13];
              if (*glyph_name == (bVar2 & 0x7f)) break;
              uVar18 = uVar18 - 1;
            }
          } while( true );
        }
        iVar5 = iVar17 + iVar6 >> 1;
        if ((char)(bVar2 & 0x7f) < (char)bVar1) {
          iVar6 = iVar5 + 1;
          iVar5 = iVar17;
        }
      }
LAB_001fd14e:
      uVar10 = uVar9 + 0x80000000;
      if (bVar3 != 0x2e) {
        uVar10 = uVar9;
      }
    }
  }
  return uVar10;
}

Assistant:

static FT_UInt32
  ps_unicode_value( const char*  glyph_name )
  {
    /* If the name begins with `uni', then the glyph name may be a */
    /* hard-coded unicode character code.                          */
    if ( glyph_name[0] == 'u' &&
         glyph_name[1] == 'n' &&
         glyph_name[2] == 'i' )
    {
      /* determine whether the next four characters following are */
      /* hexadecimal.                                             */

      /* XXX: Add code to deal with ligatures, i.e. glyph names like */
      /*      `uniXXXXYYYYZZZZ'...                                   */

      FT_Int       count;
      FT_UInt32    value = 0;
      const char*  p     = glyph_name + 3;


      for ( count = 4; count > 0; count--, p++ )
      {
        char          c = *p;
        unsigned int  d;


        d = (unsigned char)c - '0';
        if ( d >= 10 )
        {
          d = (unsigned char)c - 'A';
          if ( d >= 6 )
            d = 16;
          else
            d += 10;
        }

        /* Exit if a non-uppercase hexadecimal character was found   */
        /* -- this also catches character codes below `0' since such */
        /* negative numbers cast to `unsigned int' are far too big.  */
        if ( d >= 16 )
          break;

        value = ( value << 4 ) + d;
      }

      /* there must be exactly four hex digits */
      if ( count == 0 )
      {
        if ( *p == '\0' )
          return value;
        if ( *p == '.' )
          return (FT_UInt32)( value | VARIANT_BIT );
      }
    }

    /* If the name begins with `u', followed by four to six uppercase */
    /* hexadecimal digits, it is a hard-coded unicode character code. */
    if ( glyph_name[0] == 'u' )
    {
      FT_Int       count;
      FT_UInt32    value = 0;
      const char*  p     = glyph_name + 1;


      for ( count = 6; count > 0; count--, p++ )
      {
        char          c = *p;
        unsigned int  d;


        d = (unsigned char)c - '0';
        if ( d >= 10 )
        {
          d = (unsigned char)c - 'A';
          if ( d >= 6 )
            d = 16;
          else
            d += 10;
        }

        if ( d >= 16 )
          break;

        value = ( value << 4 ) + d;
      }

      if ( count <= 2 )
      {
        if ( *p == '\0' )
          return value;
        if ( *p == '.' )
          return (FT_UInt32)( value | VARIANT_BIT );
      }
    }

    /* Look for a non-initial dot in the glyph name in order to */
    /* find variants like `A.swash', `e.final', etc.            */
    {
      FT_UInt32    value = 0;
      const char*  p     = glyph_name;


      for ( ; *p && *p != '.'; p++ )
        ;

      /* now look up the glyph in the Adobe Glyph List;      */
      /* `.notdef', `.null' and the empty name are short cut */
      if ( p > glyph_name )
      {
        value = (FT_UInt32)ft_get_adobe_glyph_index( glyph_name, p );

        if ( *p == '.' )
          value |= (FT_UInt32)VARIANT_BIT;
      }

      return value;
    }
  }